

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlindex.cpp
# Opt level: O2

QSqlIndex * __thiscall QSqlIndex::operator=(QSqlIndex *this,QSqlIndex *other)

{
  QString::operator=(&this->cursor,&other->cursor);
  QString::operator=(&this->nm,&other->nm);
  QArrayDataPointer<bool>::operator=(&(this->sorts).d,&(other->sorts).d);
  QSqlRecord::operator=(&this->super_QSqlRecord,&other->super_QSqlRecord);
  return this;
}

Assistant:

QSqlIndex& QSqlIndex::operator=(const QSqlIndex& other)
{
    cursor = other.cursor;
    nm = other.nm;
    sorts = other.sorts;
    QSqlRecord::operator=(other);
    return *this;
}